

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint32_t fmovem_predec(CPUM68KState_conflict *env,uint32_t addr,uint32_t mask,float_access access_fn
                      )

{
  int iVar1;
  uint uVar2;
  uintptr_t unaff_retaddr;
  
  for (uVar2 = 7; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    if ((char)mask < '\0') {
      iVar1 = (*access_fn)(env,addr,env->fregs + uVar2,unaff_retaddr);
      addr = addr - iVar1;
    }
    mask = mask * 2;
  }
  return addr;
}

Assistant:

static uint32_t fmovem_predec(CPUM68KState *env, uint32_t addr, uint32_t mask,
                              float_access access_fn)
{
    uintptr_t ra = GETPC();
    int i, size;

    for (i = 7; i >= 0; i--, mask <<= 1) {
        if (mask & 0x80) {
            size = access_fn(env, addr, &env->fregs[i], ra);
            if ((mask & 0xff) != 0x80) {
                addr -= size;
            }
        }
    }

    return addr;
}